

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O0

Elf64_Verdef * __thiscall
absl::debugging_internal::ElfMemImage::GetVerdef(ElfMemImage *this,int index)

{
  bool bVar1;
  Elf64_Verdef *local_48;
  char *version_definition_as_char;
  Elf64_Verdef *version_definition;
  char *absl_raw_logging_internal_basename;
  int index_local;
  ElfMemImage *this_local;
  
  bVar1 = false;
  if (-1 < index) {
    bVar1 = (ulong)(long)index <= this->verdefnum_;
  }
  if (!bVar1) {
    raw_logging_internal::RawLog
              (kFatal,"elf_mem_image.cc",0x83,"Check %s failed: %s",
               "0 <= index && static_cast<size_t>(index) <= verdefnum_","index out of range");
  }
  version_definition_as_char = (char *)this->verdef_;
  while( true ) {
    bVar1 = false;
    if ((int)(uint)*(ushort *)(version_definition_as_char + 4) < index) {
      bVar1 = *(int *)(version_definition_as_char + 0x10) != 0;
    }
    if (!bVar1) break;
    version_definition_as_char =
         version_definition_as_char + *(uint *)(version_definition_as_char + 0x10);
  }
  if ((uint)*(ushort *)(version_definition_as_char + 4) == index) {
    local_48 = (Elf64_Verdef *)version_definition_as_char;
  }
  else {
    local_48 = (Elf64_Verdef *)0x0;
  }
  return local_48;
}

Assistant:

const ElfW(Verdef) *ElfMemImage::GetVerdef(int index) const {
  ABSL_RAW_CHECK(0 <= index && static_cast<size_t>(index) <= verdefnum_,
                 "index out of range");
  const ElfW(Verdef) *version_definition = verdef_;
  while (version_definition->vd_ndx < index && version_definition->vd_next) {
    const char *const version_definition_as_char =
        reinterpret_cast<const char *>(version_definition);
    version_definition =
        reinterpret_cast<const ElfW(Verdef) *>(version_definition_as_char +
                                               version_definition->vd_next);
  }
  return version_definition->vd_ndx == index ? version_definition : nullptr;
}